

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ilu_heap_relax_snode.c
# Opt level: O2

void ilu_heap_relax_snode
               (int n,int *et,int relax_columns,int *descendants,int *relax_end,int *relax_fsupc)

{
  int iVar1;
  int iVar2;
  int_t *addr;
  int *addr_00;
  long lVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  char msg [256];
  
  addr = intMalloc(n * 3 + 2);
  if (addr == (int_t *)0x0) {
    sprintf(msg,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for iwork[]",0x3d,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/ilu_heap_relax_snode.c"
           );
    superlu_abort_and_exit(msg);
  }
  lVar10 = (long)n;
  addr_00 = TreePostorder(n,et);
  for (lVar3 = 0; lVar3 <= lVar10; lVar3 = lVar3 + 1) {
    addr[lVar10 + (long)addr_00[lVar3] + 1] = (int_t)lVar3;
  }
  uVar4 = 0;
  uVar9 = 0;
  if (0 < n) {
    uVar9 = (ulong)(uint)n;
  }
  for (; uVar9 != uVar4; uVar4 = uVar4 + 1) {
    addr[addr_00[uVar4]] = addr_00[et[uVar4]];
    addr[lVar10 * 2 + uVar4 + 2] = et[uVar4];
  }
  for (uVar4 = 0; uVar9 != uVar4; uVar4 = uVar4 + 1) {
    et[uVar4] = addr[uVar4];
  }
  ifill(relax_end,n,-1);
  ifill(relax_fsupc,n,-1);
  for (uVar4 = 0; uVar9 != uVar4; uVar4 = uVar4 + 1) {
    descendants[uVar4] = 0;
  }
  for (uVar4 = 0; uVar9 != uVar4; uVar4 = uVar4 + 1) {
    iVar2 = et[uVar4];
    if (iVar2 != n) {
      descendants[iVar2] = descendants[uVar4] + descendants[iVar2] + 1;
    }
  }
  iVar2 = 0;
  iVar5 = 0;
  do {
    if (n <= iVar5) {
      for (uVar4 = 0; uVar9 != uVar4; uVar4 = uVar4 + 1) {
        et[uVar4] = addr[lVar10 * 2 + uVar4 + 2];
      }
      superlu_free(addr_00);
      superlu_free(addr);
      return;
    }
    lVar7 = (long)iVar5;
    lVar3 = lVar7;
    iVar8 = iVar5;
    do {
      iVar1 = iVar8;
      iVar8 = et[lVar3];
      if (iVar8 == n) break;
      lVar3 = (long)iVar8;
    } while (descendants[lVar3] < relax_columns);
    lVar6 = (long)iVar1;
    iVar8 = n;
    for (lVar3 = lVar7; lVar3 <= lVar6; lVar3 = lVar3 + 1) {
      if (addr[lVar10 + lVar3 + 1] <= iVar8) {
        iVar8 = addr[lVar10 + lVar3 + 1];
      }
    }
    if (addr[lVar10 + lVar6 + 1] - iVar8 == iVar1 - iVar5) {
      relax_end[iVar8] = addr[lVar10 + lVar6 + 1];
      lVar3 = (long)iVar2;
      iVar2 = iVar2 + 1;
      relax_fsupc[lVar3] = iVar8;
    }
    else {
      for (; lVar7 <= lVar6; lVar7 = lVar7 + 1) {
        if (descendants[lVar7] == 0) {
          iVar5 = addr[lVar10 + lVar7 + 1];
          relax_end[iVar5] = iVar5;
          lVar3 = (long)iVar2;
          iVar2 = iVar2 + 1;
          relax_fsupc[lVar3] = iVar5;
        }
      }
    }
    do {
      lVar6 = lVar6 + 1;
      iVar5 = iVar1 + 1;
      if (descendants[lVar6] == 0) break;
      iVar1 = iVar5;
    } while (lVar6 < lVar10);
  } while( true );
}

Assistant:

void
ilu_heap_relax_snode (
	     const     int n,
	     int       *et,	      /* column elimination tree */
	     const int relax_columns, /* max no of columns allowed in a
					 relaxed snode */
	     int       *descendants,  /* no of descendants of each node
					 in the etree */
	     int       *relax_end,    /* last column in a supernode
				       * if j-th column starts a relaxed
				       * supernode, relax_end[j] represents
				       * the last column of this supernode */
	     int       *relax_fsupc   /* first column in a supernode
				       * relax_fsupc[j] represents the first
				       * column of j-th supernode */
	     )
{
    register int i, j, k, l, f, parent;
    register int snode_start;	/* beginning of a snode */
    int *et_save, *post, *inv_post, *iwork;
#if ( PRNTlevel>=1 )
    int nsuper_et = 0, nsuper_et_post = 0;
#endif

    /* The etree may not be postordered, but is heap ordered. */

    iwork = (int*) intMalloc(3*n+2);
    if ( !iwork ) ABORT("SUPERLU_MALLOC fails for iwork[]");
    inv_post = iwork + n+1;
    et_save = inv_post + n+1;

    /* Post order etree */
    post = (int *) TreePostorder(n, et);
    for (i = 0; i < n+1; ++i) inv_post[post[i]] = i;

    /* Renumber etree in postorder */
    for (i = 0; i < n; ++i) {
	iwork[post[i]] = post[et[i]];
	et_save[i] = et[i]; /* Save the original etree */
    }
    for (i = 0; i < n; ++i) et[i] = iwork[i];

    /* Compute the number of descendants of each node in the etree */
    ifill (relax_end, n, SLU_EMPTY);
    ifill (relax_fsupc, n, SLU_EMPTY);
    for (j = 0; j < n; j++) descendants[j] = 0;
    for (j = 0; j < n; j++) {
	parent = et[j];
	if ( parent != n )  /* not the dummy root */
	    descendants[parent] += descendants[j] + 1;
    }

    /* Identify the relaxed supernodes by postorder traversal of the etree. */
    for ( f = j = 0; j < n; ) {
	parent = et[j];
	snode_start = j;
	while ( parent != n && descendants[parent] < relax_columns ) {
	    j = parent;
	    parent = et[j];
	}
	/* Found a supernode in postordered etree; j is the last column. */
#if ( PRNTlevel>=1 )
	++nsuper_et_post;
#endif
	k = n;
	for (i = snode_start; i <= j; ++i)
	    k = SUPERLU_MIN(k, inv_post[i]);
	l = inv_post[j];
	if ( (l - k) == (j - snode_start) ) {
	    /* It's also a supernode in the original etree */
	    relax_end[k] = l;		/* Last column is recorded */
	    relax_fsupc[f++] = k;
#if ( PRNTlevel>=1 )
	    ++nsuper_et;
#endif
	} else {
	    for (i = snode_start; i <= j; ++i) {
		l = inv_post[i];
		if ( descendants[i] == 0 ) {
		    relax_end[l] = l;
		    relax_fsupc[f++] = l;
#if ( PRNTlevel>=1 )
		    ++nsuper_et;
#endif
		}
	    }
	}
	j++;
	/* Search for a new leaf */
	while ( descendants[j] != 0 && j < n ) j++;
    }

#if ( PRNTlevel>=1 )
    printf(".. heap_snode_relax:\n"
	   "\tNo of relaxed snodes in postordered etree:\t%d\n"
	   "\tNo of relaxed snodes in original etree:\t%d\n",
	   nsuper_et_post, nsuper_et);
#endif

    /* Recover the original etree */
    for (i = 0; i < n; ++i) et[i] = et_save[i];

    SUPERLU_FREE(post);
    SUPERLU_FREE(iwork);
}